

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Accumulator.hpp
# Opt level: O0

void __thiscall
OpenMD::Utils::Accumulator<std::vector<double,_std::allocator<double>_>_>::add
          (Accumulator<std::vector<double,_std::allocator<double>_>_> *this,
          vector<double,_std::allocator<double>_> *val)

{
  long lVar1;
  double dVar2;
  double dVar3;
  bool bVar4;
  size_type sVar5;
  size_type sVar6;
  const_reference pvVar7;
  reference pvVar8;
  vector<double,_std::allocator<double>_> *in_RSI;
  long *in_RDI;
  double dVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  size_t i;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff60;
  value_type vVar12;
  size_type in_stack_ffffffffffffff68;
  vector<double,_std::allocator<double>_> *this_00;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff70;
  ulong local_18;
  
  bVar4 = std::vector<double,_std::allocator<double>_>::empty(in_stack_ffffffffffffff60);
  if (!bVar4) {
    sVar5 = std::vector<double,_std::allocator<double>_>::size(in_RSI);
    sVar6 = std::vector<double,_std::allocator<double>_>::size
                      ((vector<double,_std::allocator<double>_> *)(in_RDI + 7));
    if ((sVar5 == sVar6) ||
       (bVar4 = std::vector<double,_std::allocator<double>_>::empty(in_stack_ffffffffffffff60),
       bVar4)) goto LAB_0034e8d3;
  }
  snprintf(painCave.errMsg,2000,
           "Size of vector passed to add() did not match the size of the StaticAccumulator.");
  painCave.isFatal = 1;
  simError();
LAB_0034e8d3:
  *in_RDI = *in_RDI + 1;
  bVar4 = std::vector<double,_std::allocator<double>_>::empty(in_stack_ffffffffffffff60);
  if (bVar4) {
    std::vector<double,_std::allocator<double>_>::size(in_RSI);
    std::vector<double,_std::allocator<double>_>::resize
              (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    std::vector<double,_std::allocator<double>_>::size(in_RSI);
    std::vector<double,_std::allocator<double>_>::resize
              (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    std::vector<double,_std::allocator<double>_>::size(in_RSI);
    std::vector<double,_std::allocator<double>_>::resize
              (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    std::vector<double,_std::allocator<double>_>::size(in_RSI);
    std::vector<double,_std::allocator<double>_>::resize
              (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  }
  for (local_18 = 0; sVar5 = std::vector<double,_std::allocator<double>_>::size(in_RSI),
      local_18 < sVar5; local_18 = local_18 + 1) {
    pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](in_RSI,local_18);
    if ((*pvVar7 != 1.79769313486232e+308) || (NAN(*pvVar7))) {
      pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](in_RSI,local_18);
      vVar12 = *pvVar7;
      pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 1),local_18);
      *pvVar8 = vVar12;
      pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](in_RSI,local_18);
      dVar9 = *pvVar7;
      pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 4),local_18);
      *pvVar8 = *pvVar8 + dVar9;
      pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](in_RSI,local_18);
      vVar12 = *pvVar7;
      this_00 = (vector<double,_std::allocator<double>_> *)(in_RDI + 7);
      pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](this_00,local_18);
      lVar1 = *in_RDI;
      auVar10._8_4_ = (int)((ulong)lVar1 >> 0x20);
      auVar10._0_8_ = lVar1;
      auVar10._12_4_ = 0x45300000;
      dVar9 = (vVar12 - *pvVar8) /
              ((auVar10._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)lVar1) - 4503599627370496.0));
      pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](this_00,local_18);
      *pvVar8 = *pvVar8 + dVar9;
      pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](in_RSI,local_18);
      dVar9 = *pvVar7;
      pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](in_RSI,local_18);
      dVar2 = *pvVar7;
      pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 10),local_18);
      dVar3 = *pvVar8;
      lVar1 = *in_RDI;
      auVar11._8_4_ = (int)((ulong)lVar1 >> 0x20);
      auVar11._0_8_ = lVar1;
      auVar11._12_4_ = 0x45300000;
      pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 10),local_18);
      *pvVar8 = (dVar9 * dVar2 - dVar3) /
                ((auVar11._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)lVar1) - 4503599627370496.0)) + *pvVar8;
    }
  }
  return;
}

Assistant:

void add(const std::vector<RealType>& val) {
      if (val.empty() || (val.size() != Avg_.size() && !Avg_.empty())) {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "Size of vector passed to add() did not "
                 "match the size of the StaticAccumulator.");
        painCave.isFatal = 1;
        simError();
      }

      Count_++;

      if (Avg_.empty()) {
        Val_.resize(val.size());
        Total_.resize(val.size());
        Avg_.resize(val.size());
        Avg2_.resize(val.size());
      }

      for (std::size_t i = 0; i < val.size(); i++) {
        /* If our placeholder, BinEmptyFlag, is passed to add(), we should
            not record data at the current index */
        if (val[i] == BinEmptyFlag) continue;
        Val_[i] = val[i];
        Total_[i] += val[i];
        Avg_[i] += (val[i] - Avg_[i]) / static_cast<RealType>(Count_);
        Avg2_[i] +=
            (val[i] * val[i] - Avg2_[i]) / static_cast<RealType>(Count_);
      }
    }